

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

void __thiscall EOPlus::Parser::ParseGlobal(Parser *this)

{
  bool bVar1;
  int iVar2;
  Parser_Error *pPVar3;
  pointer pPVar4;
  Token *t_00;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_State>_&>::value,_pair<iterator,_bool>_>
  _Var5;
  Token local_3c0;
  string local_370;
  allocator<char> local_349;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  undefined1 local_2e2;
  allocator<char> local_2e1;
  string local_2e0;
  undefined1 local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  _Base_ptr local_278;
  byte local_270;
  _Base_ptr local_268;
  byte local_260;
  undefined1 local_258 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
  state;
  Info local_128;
  undefined1 local_f2;
  allocator<char> local_f1;
  string local_f0;
  string local_d0;
  variant local_a0;
  undefined1 local_60 [8];
  Token t;
  Parser *this_local;
  
  t._72_8_ = this;
  util::variant::variant(&local_a0);
  Token::Token((Token *)local_60,Invalid,&local_a0);
  util::variant::~variant(&local_a0);
  while (bVar1 = GetToken(this,(Token *)local_60,0x101), bVar1) {
    if (local_60._0_4_ == Identifier) {
      util::variant::operator_cast_to_string(&local_d0,(variant *)&t);
      bVar1 = std::operator==(&local_d0,"main");
      std::__cxx11::string::~string((string *)&local_d0);
      if (bVar1) {
        if ((this->quest->has_info & 1U) != 0) {
          local_f2 = 1;
          pPVar3 = (Parser_Error *)__cxa_allocate_exception(0x18);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,"Quest can only contain one main-block.",&local_f1);
          pPVar4 = std::
                   unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ::operator->(&this->tok);
          iVar2 = Parser_Token_Server_Base::RejectLine(pPVar4);
          Parser_Error::Parser_Error(pPVar3,&local_f0,iVar2);
          local_f2 = 0;
          __cxa_throw(pPVar3,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
        }
        ParseMainBlock(&local_128,this);
        Info::operator=(&this->quest->info,&local_128);
        Info::~Info(&local_128);
        this->quest->has_info = true;
      }
      else {
        util::variant::operator_cast_to_string((string *)&state.second.goal_rule,(variant *)&t);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&state.second.goal_rule,"state");
        std::__cxx11::string::~string((string *)&state.second.goal_rule);
        if (!bVar1) break;
        ParseStateBlock_abi_cxx11_
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
                    *)local_258,this);
        _Var5 = std::
                map<std::__cxx11::string,EOPlus::State,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,EOPlus::State>>>
                ::insert<std::pair<std::__cxx11::string,EOPlus::State>&>
                          ((map<std::__cxx11::string,EOPlus::State,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,EOPlus::State>>>
                            *)&this->quest->states,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
                            *)local_258);
        local_278 = (_Base_ptr)_Var5.first._M_node;
        local_270 = _Var5.second;
        local_268 = local_278;
        local_260 = local_270;
        if (((local_270 ^ 0xff) & 1) != 0) {
          local_2b9 = 1;
          pPVar3 = (Parser_Error *)__cxa_allocate_exception(0x18);
          std::operator+(&local_2b8,"State \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_258);
          std::operator+(&local_298,&local_2b8,"\' already exists");
          pPVar4 = std::
                   unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                   ::operator->(&this->tok);
          iVar2 = Parser_Token_Server_Base::RejectLine(pPVar4);
          Parser_Error::Parser_Error(pPVar3,&local_298,iVar2);
          local_2b9 = 0;
          __cxa_throw(pPVar3,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EOPlus::State>
                 *)local_258);
      }
    }
    else if (local_60._0_4_ == EndOfFile) {
      if ((this->quest->has_info & 1U) != 0) {
        Token::~Token((Token *)local_60);
        return;
      }
      local_2e2 = 1;
      pPVar3 = (Parser_Error *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2e0,"No main-block in quest file.",&local_2e1);
      pPVar4 = std::
               unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ::operator->(&this->tok);
      iVar2 = Parser_Token_Server_Base::RejectLine(pPVar4);
      Parser_Error::Parser_Error(pPVar3,&local_2e0,iVar2);
      local_2e2 = 0;
      __cxa_throw(pPVar3,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
    }
  }
  pPVar3 = (Parser_Error *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"Expected block-identifier (main/state) in global scope.",
             &local_349);
  std::operator+(&local_328,&local_348," Got: ");
  pPVar4 = std::
           unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ::operator->(&this->tok);
  Parser_Token_Server_Base::RejectToken(&local_3c0,pPVar4);
  token_got_string_abi_cxx11_(&local_370,(EOPlus *)&local_3c0,t_00);
  std::operator+(&local_308,&local_328,&local_370);
  pPVar4 = std::
           unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ::operator->(&this->tok);
  iVar2 = Parser_Token_Server_Base::RejectLine(pPVar4);
  Parser_Error::Parser_Error(pPVar3,&local_308,iVar2);
  __cxa_throw(pPVar3,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
}

Assistant:

void Parser::ParseGlobal()
	{
		Token t;

		while (this->GetToken(t, Token::Identifier | Token::EndOfFile))
		{
			if (t.type == Token::Identifier)
			{
				if (std::string(t.data) == "main")
				{
					if (quest.has_info)
						PARSER_ERROR("Quest can only contain one main-block.");

					quest.info = this->ParseMainBlock();
					quest.has_info = true;
				}
				else if (std::string(t.data) == "state")
				{
					auto state = this->ParseStateBlock();

					if (!this->quest.states.insert(state).second)
						PARSER_ERROR("State '" + state.first + "' already exists");
				}
				else
				{
					break;
				}
			}
			else if (t.type == Token::EndOfFile)
			{
				if (!quest.has_info)
					PARSER_ERROR("No main-block in quest file.");

				return;
			}
		}

		PARSER_ERROR_GOT("Expected block-identifier (main/state) in global scope.");
	}